

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

bool __thiscall ExtendedMatrix::SwapRows(ExtendedMatrix *this,int first_row,int second_row)

{
  bool bVar1;
  bool bVar2;
  bool result;
  int second_row_local;
  int first_row_local;
  ExtendedMatrix *this_local;
  
  bVar1 = Matrix::SwapRows(&this->main_,first_row,second_row);
  bVar2 = Matrix::SwapRows(&this->extension_,first_row,second_row);
  if (bVar1 || bVar2) {
    Permutation::Transposition(&this->row_permutation_,first_row,second_row);
  }
  return bVar1 || bVar2;
}

Assistant:

bool ExtendedMatrix::SwapRows(int first_row, int second_row) {
  bool result = false;
  result |= main_.SwapRows(first_row, second_row);
  result |= extension_.SwapRows(first_row, second_row);

  if (result) {
    row_permutation_.Transposition(first_row, second_row);
  }

  return result;
}